

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O2

Error * ot::commissioner::WriteFile(Error *__return_storage_ptr__,string *aData,string *aFilename)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  __stream = fopen((aFilename->_M_dataplus)._M_p,"w");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 == 0xd) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "access denied on path \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar3 = "access denied on path \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      while (pcVar4 = pcVar3, pcVar4 != "") {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar4,"",&local_68);
        }
      }
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar2);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = (char *)0x1e;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"access denied on path \'{}\', {}",fmt_00,args_00);
      local_90._0_4_ = kIOBusy;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    }
    else if ((iVar1 == 0x15) || (iVar1 == 0x11)) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "path already exists \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1c;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar3 = "path already exists \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      while (pcVar4 = pcVar3, pcVar4 != "") {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar4,"",&local_68);
        }
      }
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar2);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_68;
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x1c;
      ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"path already exists \'{}\', {}",fmt,args);
      local_90._0_4_ = kAlreadyExists;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    }
    else {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "error on opening file \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar3 = "error on opening file \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      while (pcVar4 = pcVar3, pcVar4 != "") {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar4,"",&local_68);
        }
      }
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar2);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      fmt_01.size_ = 0xcd;
      fmt_01.data_ = (char *)0x1e;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"error on opening file \'{}\', {}",fmt_01,args_01);
      local_90._0_4_ = kIOError;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    }
    Error::operator=(__return_storage_ptr__,(Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    fputs((aData->_M_dataplus)._M_p,__stream);
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

Error WriteFile(const std::string &aData, const std::string &aFilename)
{
    Error error;
    FILE *f = fopen(aFilename.c_str(), "w");

    if (f == nullptr)
    {
        switch (errno)
        {
        case EEXIST:
        case EISDIR:
            ExitNow(error = ERROR_ALREADY_EXISTS("path already exists '{}', {}", aFilename, strerror(errno)));
            break;

        case EACCES:
            ExitNow(error = ERROR_IO_BUSY("access denied on path '{}', {}", aFilename, strerror(errno)));
            break;

        default:
            ExitNow(error = ERROR_IO_ERROR("error on opening file '{}', {}", aFilename, strerror(errno)));
        }
    }

    fputs(aData.c_str(), f);

exit:
    if (f != nullptr)
    {
        fclose(f);
    }

    return error;
}